

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

void __thiscall
ImGuiInputTextCallbackData::InsertChars
          (ImGuiInputTextCallbackData *this,int pos,char *new_text,char *new_text_end)

{
  uint uVar1;
  ImGuiContext *pIVar2;
  int iVar3;
  int iVar4;
  size_t sVar5;
  bool bVar6;
  int local_54;
  int new_buf_size;
  ImGuiInputTextState *edit_state;
  ImGuiContext *g;
  int new_text_len;
  bool is_resizable;
  char *new_text_end_local;
  char *new_text_local;
  int pos_local;
  ImGuiInputTextCallbackData *this_local;
  
  uVar1 = this->Flags;
  if (new_text_end == (char *)0x0) {
    sVar5 = strlen(new_text);
    local_54 = (int)sVar5;
  }
  else {
    local_54 = (int)new_text_end - (int)new_text;
  }
  pIVar2 = GImGui;
  if (this->BufSize <= local_54 + this->BufTextLen) {
    if ((uVar1 & 0x40000) == 0) {
      return;
    }
    bVar6 = false;
    if ((GImGui->InputTextState).ID != 0) {
      bVar6 = GImGui->ActiveId == (GImGui->InputTextState).ID;
    }
    if (!bVar6) {
      __assert_fail("edit_state->ID != 0 && g.ActiveId == edit_state->ID",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/awolven[P]cimgui/imgui/imgui_widgets.cpp"
                    ,0xcc3,
                    "void ImGuiInputTextCallbackData::InsertChars(int, const char *, const char *)")
      ;
    }
    if (this->Buf != (GImGui->InputTextState).TextA.Data) {
      __assert_fail("Buf == edit_state->TextA.Data",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/awolven[P]cimgui/imgui/imgui_widgets.cpp"
                    ,0xcc4,
                    "void ImGuiInputTextCallbackData::InsertChars(int, const char *, const char *)")
      ;
    }
    iVar4 = this->BufTextLen;
    iVar3 = ImMax<int>(0x100,local_54);
    iVar3 = ImClamp<int>(local_54 << 2,0x20,iVar3);
    iVar4 = iVar4 + iVar3;
    iVar3 = iVar4 + 1;
    ImVector<char>::reserve(&(pIVar2->InputTextState).TextA,iVar4 + 2);
    this->Buf = (pIVar2->InputTextState).TextA.Data;
    (pIVar2->InputTextState).BufCapacityA = iVar3;
    this->BufSize = iVar3;
  }
  if (this->BufTextLen != pos) {
    memmove(this->Buf + (long)local_54 + (long)pos,this->Buf + pos,(long)(this->BufTextLen - pos));
  }
  memcpy(this->Buf + pos,new_text,(long)local_54);
  this->Buf[this->BufTextLen + local_54] = '\0';
  if (pos <= this->CursorPos) {
    this->CursorPos = local_54 + this->CursorPos;
  }
  this->SelectionEnd = this->CursorPos;
  this->SelectionStart = this->CursorPos;
  this->BufDirty = true;
  this->BufTextLen = local_54 + this->BufTextLen;
  return;
}

Assistant:

void ImGuiInputTextCallbackData::InsertChars(int pos, const char* new_text, const char* new_text_end)
{
    const bool is_resizable = (Flags & ImGuiInputTextFlags_CallbackResize) != 0;
    const int new_text_len = new_text_end ? (int)(new_text_end - new_text) : (int)strlen(new_text);
    if (new_text_len + BufTextLen >= BufSize)
    {
        if (!is_resizable)
            return;

        // Contrary to STB_TEXTEDIT_INSERTCHARS() this is working in the UTF8 buffer, hence the midly similar code (until we remove the U16 buffer alltogether!)
        ImGuiContext& g = *GImGui;
        ImGuiInputTextState* edit_state = &g.InputTextState;
        IM_ASSERT(edit_state->ID != 0 && g.ActiveId == edit_state->ID);
        IM_ASSERT(Buf == edit_state->TextA.Data);
        int new_buf_size = BufTextLen + ImClamp(new_text_len * 4, 32, ImMax(256, new_text_len)) + 1;
        edit_state->TextA.reserve(new_buf_size + 1);
        Buf = edit_state->TextA.Data;
        BufSize = edit_state->BufCapacityA = new_buf_size;
    }

    if (BufTextLen != pos)
        memmove(Buf + pos + new_text_len, Buf + pos, (size_t)(BufTextLen - pos));
    memcpy(Buf + pos, new_text, (size_t)new_text_len * sizeof(char));
    Buf[BufTextLen + new_text_len] = '\0';

    if (CursorPos >= pos)
        CursorPos += new_text_len;
    SelectionStart = SelectionEnd = CursorPos;
    BufDirty = true;
    BufTextLen += new_text_len;
}